

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mk_plugin.c
# Opt level: O2

mk_plugin * mk_plugin_load(int type,char *shortname,void *data,mk_server *server)

{
  uint uVar1;
  mk_list *pmVar2;
  mk_plugin_stage *pmVar3;
  mk_list *pmVar4;
  int iVar5;
  void *pvVar6;
  mk_plugin *pmVar7;
  undefined8 *puVar8;
  char *pcVar9;
  char symbol [64];
  
  if (type == 1) {
    pvVar6 = mk_plugin_load_dynamic((char *)data);
    if (pvVar6 != (void *)0x0) {
      snprintf(symbol,0x3f,"mk_plugin_%s",shortname);
      pmVar7 = (mk_plugin *)mk_plugin_load_symbol(pvVar6,symbol);
      if (pmVar7 == (mk_plugin *)0x0) {
        pcVar9 = "Plugin \'%s\' is not registering properly";
      }
      else {
        pmVar2 = &server->plugins;
        do {
          pmVar2 = pmVar2->next;
          if (pmVar2 == &server->plugins) {
            pmVar7->load_type = 1;
            pmVar7->handler = pvVar6;
            pcVar9 = mk_string_dup((char *)data);
            pmVar7->path = pcVar9;
            data = pmVar7;
            goto LAB_0010e42c;
          }
        } while ((*(int *)&pmVar2[2].prev != 0) ||
                (iVar5 = strcmp((char *)pmVar2[-7].next,pmVar7->name), iVar5 != 0));
        data = pmVar2[-7].prev;
        pcVar9 = "Plugin \'%s\' have been built-in.";
      }
      mk_print(0x1002,pcVar9,data);
      dlclose(pvVar6);
      return (mk_plugin *)0x0;
    }
  }
  else if (type == 0) {
    *(undefined4 *)((long)data + 0x98) = 0;
LAB_0010e42c:
    if ((((((mk_plugin *)data)->shortname == (char *)0x0) ||
         (((mk_plugin *)data)->name == (char *)0x0)) ||
        (((mk_plugin *)data)->version == (char *)0x0)) ||
       ((((mk_plugin *)data)->init_plugin == (_func_int_mk_plugin_ptr_char_ptr *)0x0 ||
        (((mk_plugin *)data)->exit_plugin == (_func_int_mk_plugin_ptr *)0x0)))) {
      data = (mk_plugin *)0x0;
      mk_print(0x1002,"Plugin \'%s\' is not registering all fields properly",shortname);
    }
    else {
      uVar1 = ((mk_plugin *)data)->hooks;
      if (((char)uVar1 < '\0') && (((mk_plugin *)data)->network == (mk_plugin_network *)0x0)) {
        mk_print(0x1003,"Bug found in %s() at %s:%d","mk_plugin_load",
                 "/workspace/llm4binary/github/license_c_cmakelists/monkey[P]monkey/mk_server/mk_plugin.c"
                 ,0xd1);
        abort();
      }
      pmVar2 = &((mk_plugin *)data)->stage_list;
      (((mk_plugin *)data)->stage_list).next = pmVar2;
      (((mk_plugin *)data)->stage_list).prev = pmVar2;
      if ((uVar1 >> 8 & 1) != 0) {
        pmVar3 = ((mk_plugin *)data)->stage;
        if (pmVar3->stage10 != (_func_int_int *)0x0) {
          puVar8 = (undefined8 *)mk_mem_alloc(0x60);
          *puVar8 = pmVar3->stage10;
          puVar8[7] = data;
          pmVar4 = (server->stage10_handler).prev;
          (server->stage10_handler).prev = (mk_list *)(puVar8 + 8);
          puVar8[9] = &server->stage10_handler;
          puVar8[8] = pmVar4;
          pmVar4->next = (mk_list *)(puVar8 + 8);
          pmVar4 = (((mk_plugin *)data)->stage_list).prev;
          (((mk_plugin *)data)->stage_list).prev = (mk_list *)(puVar8 + 10);
          puVar8[0xb] = pmVar2;
          puVar8[10] = pmVar4;
          pmVar4->next = (mk_list *)(puVar8 + 10);
        }
        if (pmVar3->stage20 != (_func_int_mk_http_session_ptr_mk_http_request_ptr *)0x0) {
          pvVar6 = mk_mem_alloc(0x60);
          *(_func_int_mk_http_session_ptr_mk_http_request_ptr **)((long)pvVar6 + 8) =
               pmVar3->stage20;
          *(void **)((long)pvVar6 + 0x38) = data;
          pmVar4 = (server->stage20_handler).prev;
          (server->stage20_handler).prev = (mk_list *)((long)pvVar6 + 0x40);
          *(mk_list **)((long)pvVar6 + 0x48) = &server->stage20_handler;
          *(mk_list **)((long)pvVar6 + 0x40) = pmVar4;
          pmVar4->next = (mk_list *)((long)pvVar6 + 0x40);
          pmVar4 = (((mk_plugin *)data)->stage_list).prev;
          (((mk_plugin *)data)->stage_list).prev = (mk_list *)((long)pvVar6 + 0x50);
          *(mk_list **)((long)pvVar6 + 0x58) = pmVar2;
          *(mk_list **)((long)pvVar6 + 0x50) = pmVar4;
          pmVar4->next = (mk_list *)((long)pvVar6 + 0x50);
        }
        if (pmVar3->stage30 !=
            (_func_int_mk_plugin_ptr_mk_http_session_ptr_mk_http_request_ptr_int_mk_list_ptr *)0x0)
        {
          pvVar6 = mk_mem_alloc(0x60);
          *(_func_int_mk_plugin_ptr_mk_http_session_ptr_mk_http_request_ptr_int_mk_list_ptr **)
           ((long)pvVar6 + 0x10) = pmVar3->stage30;
          *(void **)((long)pvVar6 + 0x38) = data;
          pmVar4 = (server->stage30_handler).prev;
          (server->stage30_handler).prev = (mk_list *)((long)pvVar6 + 0x40);
          *(mk_list **)((long)pvVar6 + 0x48) = &server->stage30_handler;
          *(mk_list **)((long)pvVar6 + 0x40) = pmVar4;
          pmVar4->next = (mk_list *)((long)pvVar6 + 0x40);
          pmVar4 = (((mk_plugin *)data)->stage_list).prev;
          (((mk_plugin *)data)->stage_list).prev = (mk_list *)((long)pvVar6 + 0x50);
          *(mk_list **)((long)pvVar6 + 0x58) = pmVar2;
          *(mk_list **)((long)pvVar6 + 0x50) = pmVar4;
          pmVar4->next = (mk_list *)((long)pvVar6 + 0x50);
        }
        if (pmVar3->stage40 != (_func_int_mk_http_session_ptr_mk_http_request_ptr *)0x0) {
          pvVar6 = mk_mem_alloc(0x60);
          *(_func_int_mk_http_session_ptr_mk_http_request_ptr **)((long)pvVar6 + 0x28) =
               pmVar3->stage40;
          *(void **)((long)pvVar6 + 0x38) = data;
          pmVar4 = (server->stage40_handler).prev;
          (server->stage40_handler).prev = (mk_list *)((long)pvVar6 + 0x40);
          *(mk_list **)((long)pvVar6 + 0x48) = &server->stage40_handler;
          *(mk_list **)((long)pvVar6 + 0x40) = pmVar4;
          pmVar4->next = (mk_list *)((long)pvVar6 + 0x40);
          pmVar4 = (((mk_plugin *)data)->stage_list).prev;
          (((mk_plugin *)data)->stage_list).prev = (mk_list *)((long)pvVar6 + 0x50);
          *(mk_list **)((long)pvVar6 + 0x58) = pmVar2;
          *(mk_list **)((long)pvVar6 + 0x50) = pmVar4;
          pmVar4->next = (mk_list *)((long)pvVar6 + 0x50);
        }
        if (pmVar3->stage50 != (_func_int_int *)0x0) {
          pvVar6 = mk_mem_alloc(0x60);
          *(_func_int_int **)((long)pvVar6 + 0x30) = pmVar3->stage50;
          *(void **)((long)pvVar6 + 0x38) = data;
          pmVar4 = (server->stage50_handler).prev;
          (server->stage50_handler).prev = (mk_list *)((long)pvVar6 + 0x40);
          *(mk_list **)((long)pvVar6 + 0x48) = &server->stage50_handler;
          *(mk_list **)((long)pvVar6 + 0x40) = pmVar4;
          pmVar4->next = (mk_list *)((long)pvVar6 + 0x40);
          pmVar4 = (((mk_plugin *)data)->stage_list).prev;
          (((mk_plugin *)data)->stage_list).prev = (mk_list *)((long)pvVar6 + 0x50);
          *(mk_list **)((long)pvVar6 + 0x58) = pmVar2;
          *(mk_list **)((long)pvVar6 + 0x50) = pmVar4;
          pmVar4->next = (mk_list *)((long)pvVar6 + 0x50);
        }
      }
      if (type == 1) {
        pmVar2 = (server->plugins).prev;
        (server->plugins).prev = &((mk_plugin *)data)->_head;
        (((mk_plugin *)data)->_head).next = &server->plugins;
        (((mk_plugin *)data)->_head).prev = pmVar2;
        pmVar2->next = &((mk_plugin *)data)->_head;
      }
    }
    return (mk_plugin *)data;
  }
  return (mk_plugin *)0x0;
}

Assistant:

struct mk_plugin *mk_plugin_load(int type, const char *shortname,
                                 void *data, struct mk_server *server)
{
    char *path;
    char symbol[64];
    void *handler;
    struct mk_list *head;
    struct mk_plugin *tmp;
    struct mk_plugin *plugin = NULL;
    struct mk_plugin_stage *stage;

    /* Set main struct name to reference */
    if (type == MK_PLUGIN_DYNAMIC) {
        path = (char *) data;
        handler = mk_plugin_load_dynamic(path);
        if (!handler) {
            return NULL;
        }

        snprintf(symbol, sizeof(symbol) - 1, "mk_plugin_%s", shortname);
        plugin  = mk_plugin_load_symbol(handler, symbol);
        if (!plugin) {
            mk_warn("Plugin '%s' is not registering properly", path);
#ifdef _WIN32
            FreeLibrary((HMODULE)handler);
#else
            dlclose(handler);
#endif
            return NULL;
        }

        /* Make sure this is not loaded twice (ref #218) */
        mk_list_foreach(head, &server->plugins) {
            tmp = mk_list_entry(head, struct mk_plugin, _head);
            if (tmp->load_type == MK_PLUGIN_STATIC &&
                strcmp(tmp->name, plugin->name) == 0){
                mk_warn("Plugin '%s' have been built-in.",
                        tmp->shortname);
#ifdef _WIN32
                FreeLibrary((HMODULE)handler);
#else
                dlclose(handler);
#endif
                return NULL;
            }
        }

        plugin->load_type = MK_PLUGIN_DYNAMIC;
        plugin->handler   = handler;
        plugin->path      = mk_string_dup(path);
    }
    else if (type == MK_PLUGIN_STATIC) {
        plugin = (struct mk_plugin *) data;
        plugin->load_type = MK_PLUGIN_STATIC;
    }

    if (!plugin) {
        return NULL;
    }

    /* Validate all callbacks are set */
    if (!plugin->shortname || !plugin->name || !plugin->version ||
        !plugin->init_plugin || !plugin->exit_plugin) {
        mk_warn("Plugin '%s' is not registering all fields properly",
                shortname);
        return NULL;
    }

    if (plugin->hooks & MK_PLUGIN_NETWORK_LAYER) {
        mk_bug(!plugin->network);
    }

    mk_list_init(&plugin->stage_list);
    if (plugin->hooks & MK_PLUGIN_STAGE) {
        struct mk_plugin_stage *st;

        stage = plugin->stage;
        if (stage->stage10) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage10 = stage->stage10;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage10_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage20) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage20 = stage->stage20;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage20_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage30) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage30 = stage->stage30;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage30_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage40) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage40 = stage->stage40;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage40_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
        if (stage->stage50) {
            st = mk_mem_alloc(sizeof(struct mk_plugin_stage));
            st->stage50 = stage->stage50;
            st->plugin  = plugin;
            mk_list_add(&st->_head, &server->stage50_handler);
            mk_list_add(&st->_parent_head, &plugin->stage_list);
        }
    }

    if (type == MK_PLUGIN_DYNAMIC) {
        /* Add Plugin to the end of the list */
        mk_list_add(&plugin->_head, &server->plugins);
    }

    return plugin;
}